

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O2

int testInvalidSliceStaticNoParams(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *this;
  SliceStaticLayerParams *this_00;
  ostream *poVar7;
  string *psVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  Result res1;
  
  CoreML::Specification::Model::Model(&m);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description(&m);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar2->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m);
  pNVar6->arrayinputshapemapping_ = 1;
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                   (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(this,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this,"output");
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_slicestatic(this);
  iVar10 = 1;
  CoreML::Specification::SliceStaticLayerParams::add_endmasks(this_00,true);
  CoreML::validate<(MLModelType)500>(&res1,&m);
  bVar1 = CoreML::Result::good(&res1);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1575);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar11 = "!((res1).good())";
  }
  else {
    psVar8 = CoreML::Result::message_abi_cxx11_(&res1);
    lVar9 = std::__cxx11::string::find((char *)psVar8,0x265a00);
    if (lVar9 != -1) {
      CoreML::Specification::SliceStaticLayerParams::add_beginids(this_00,0);
      CoreML::validate<(MLModelType)500>(&res2,&m);
      bVar1 = CoreML::Result::good(&res2);
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                );
        poVar7 = std::operator<<(poVar7,":");
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x157b);
        poVar7 = std::operator<<(poVar7,": error: ");
        pcVar11 = "!((res2).good())";
LAB_00151fd5:
        poVar7 = std::operator<<(poVar7,pcVar11);
        poVar7 = std::operator<<(poVar7," was false, expected true.");
        std::endl<char,std::char_traits<char>>(poVar7);
        iVar10 = 1;
      }
      else {
        psVar8 = CoreML::Result::message_abi_cxx11_(&res2);
        lVar9 = std::__cxx11::string::find((char *)psVar8,0x265a51);
        if (lVar9 == -1) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x157c);
          poVar7 = std::operator<<(poVar7,": error: ");
          pcVar11 = "res2.message().find(\"End IDs\") != std::string::npos";
          goto LAB_00151fd5;
        }
        CoreML::Specification::SliceStaticLayerParams::add_endids(this_00,5);
        CoreML::validate<(MLModelType)500>(&res3,&m);
        bVar1 = CoreML::Result::good(&res3);
        if (bVar1) {
          poVar7 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                  );
          poVar7 = std::operator<<(poVar7,":");
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1581);
          poVar7 = std::operator<<(poVar7,": error: ");
          pcVar11 = "!((res3).good())";
LAB_001520db:
          poVar7 = std::operator<<(poVar7,pcVar11);
          poVar7 = std::operator<<(poVar7," was false, expected true.");
          std::endl<char,std::char_traits<char>>(poVar7);
          iVar10 = 1;
        }
        else {
          psVar8 = CoreML::Result::message_abi_cxx11_(&res3);
          lVar9 = std::__cxx11::string::find((char *)psVar8,0x265a9e);
          if (lVar9 == -1) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1582);
            poVar7 = std::operator<<(poVar7,": error: ");
            pcVar11 = "res3.message().find(\"Strides\") != std::string::npos";
            goto LAB_001520db;
          }
          CoreML::Specification::SliceStaticLayerParams::add_strides(this_00,1);
          CoreML::validate<(MLModelType)500>(&res4,&m);
          bVar1 = CoreML::Result::good(&res4);
          if (bVar1) {
            poVar7 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                    );
            poVar7 = std::operator<<(poVar7,":");
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1587);
            poVar7 = std::operator<<(poVar7,": error: ");
            pcVar11 = "!((res4).good())";
LAB_001521e5:
            poVar7 = std::operator<<(poVar7,pcVar11);
            poVar7 = std::operator<<(poVar7," was false, expected true.");
            std::endl<char,std::char_traits<char>>(poVar7);
          }
          else {
            psVar8 = CoreML::Result::message_abi_cxx11_(&res4);
            lVar9 = std::__cxx11::string::find((char *)psVar8,0x265aeb);
            if (lVar9 == -1) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1588);
              poVar7 = std::operator<<(poVar7,": error: ");
              pcVar11 = "res4.message().find(\"Begin masks\") != std::string::npos";
              goto LAB_001521e5;
            }
            CoreML::Specification::SliceStaticLayerParams::add_beginmasks(this_00,true);
            (this_00->endmasks_).current_size_ = 0;
            CoreML::validate<(MLModelType)500>(&res5,&m);
            bVar1 = CoreML::Result::good(&res5);
            if (bVar1) {
              poVar7 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                      );
              poVar7 = std::operator<<(poVar7,":");
              poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x158e);
              poVar7 = std::operator<<(poVar7,": error: ");
              pcVar11 = "!((res5).good())";
LAB_00152271:
              poVar7 = std::operator<<(poVar7,pcVar11);
              poVar7 = std::operator<<(poVar7," was false, expected true.");
              std::endl<char,std::char_traits<char>>(poVar7);
              iVar10 = 1;
            }
            else {
              psVar8 = CoreML::Result::message_abi_cxx11_(&res5);
              iVar10 = 0;
              lVar9 = std::__cxx11::string::find((char *)psVar8,0x265b40);
              if (lVar9 == -1) {
                poVar7 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                                        );
                poVar7 = std::operator<<(poVar7,":");
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x158f);
                poVar7 = std::operator<<(poVar7,": error: ");
                pcVar11 = "res5.message().find(\"End masks\") != std::string::npos";
                goto LAB_00152271;
              }
            }
            std::__cxx11::string::~string((string *)&res5.m_message);
          }
          std::__cxx11::string::~string((string *)&res4.m_message);
        }
        std::__cxx11::string::~string((string *)&res3.m_message);
      }
      std::__cxx11::string::~string((string *)&res2.m_message);
      goto LAB_001522c0;
    }
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x1576);
    poVar7 = std::operator<<(poVar7,": error: ");
    pcVar11 = "res1.message().find(\"Begin IDs\") != std::string::npos";
  }
  poVar7 = std::operator<<(poVar7,pcVar11);
  poVar7 = std::operator<<(poVar7," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar7);
  iVar10 = 1;
LAB_001522c0:
  std::__cxx11::string::~string((string *)&res1.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar10;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}